

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

__pid_t __thiscall embree::BarrierSys::wait(BarrierSys *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  __pid_t extraout_EAX_00;
  __pid_t _Var1;
  MutexSys *unaff_retaddr;
  ConditionSys *this_00;
  
  this_00 = (ConditionSys *)this->opaque;
  MutexSys::lock(unaff_retaddr);
  this_00[2].cond = (void *)((long)this_00[2].cond + 1);
  if (this_00[2].cond == this_00[3].cond) {
    this_00[2].cond = (void *)0x0;
    ConditionSys::notify_all(this_00);
    MutexSys::unlock(unaff_retaddr);
    _Var1 = extraout_EAX;
  }
  else {
    ConditionSys::wait(this_00 + 1,this_00);
    MutexSys::unlock(unaff_retaddr);
    _Var1 = extraout_EAX_00;
  }
  return _Var1;
}

Assistant:

void BarrierSys::wait() {
    ((BarrierSysImplementation*) opaque)->wait();
  }